

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3_str_append(sqlite3_str *p,char *z,int N)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = p->nChar;
  uVar2 = uVar1 + N;
  if (p->nAlloc <= uVar2) {
    enlargeAndAppend(p,z,N);
    return;
  }
  if (N != 0) {
    p->nChar = uVar2;
    memcpy(p->zText + uVar1,z,(long)N);
    return;
  }
  return;
}

Assistant:

SQLITE_API void sqlite3_str_append(sqlite3_str *p, const char *z, int N){
  assert( z!=0 || N==0 );
  assert( p->zText!=0 || p->nChar==0 || p->accError );
  assert( N>=0 );
  assert( p->accError==0 || p->nAlloc==0 || p->mxAlloc==0 );
  if( p->nChar+N >= p->nAlloc ){
    enlargeAndAppend(p,z,N);
  }else if( N ){
    assert( p->zText );
    p->nChar += N;
    memcpy(&p->zText[p->nChar-N], z, N);
  }
}